

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

bool __thiscall
AddrManImpl::AddSingle(AddrManImpl *this,CAddress *addr,CNetAddr *source,seconds time_penalty)

{
  ServiceFlags *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  AddrInfo *this_00;
  time_point tVar6;
  long lVar7;
  uint64_t uVar8;
  long lVar9;
  mapped_type *this_01;
  Logger *this_02;
  rep rVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  uint32_t mapped_as;
  int nUBucketPos;
  int nUBucket;
  nid_type nId;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CNetAddr::IsRoutable((CNetAddr *)addr);
  if (!bVar2) goto LAB_0084bb66;
  this_00 = Find(this,&addr->super_CService,&nId);
  bVar2 = ::operator==((CNetAddr *)addr,source);
  if (bVar2) {
    time_penalty.__r = 0;
  }
  if (this_00 == (AddrInfo *)0x0) {
    this_00 = Create(this,addr,source,&nId);
    lVar9 = (this_00->super_CAddress).nTime.__d.__r - time_penalty.__r;
    rVar10 = 0;
    if (0 < lVar9) {
      rVar10 = lVar9;
    }
    (this_00->super_CAddress).nTime.__d.__r = rVar10;
  }
  else {
    tVar6 = NodeClock::now();
    lVar9 = (addr->nTime).__d.__r;
    lVar11 = lVar9 - time_penalty.__r;
    lVar13 = lVar11 + -0x15180;
    if (lVar9 * -1000000000 + (long)tVar6.__d.__r < 86400000000000) {
      lVar13 = lVar11 + -0xe10;
    }
    lVar7 = (this_00->super_CAddress).nTime.__d.__r;
    if (lVar7 < lVar13) {
      lVar7 = 0;
      if (0 < lVar11) {
        lVar7 = lVar11;
      }
      (this_00->super_CAddress).nTime.__d.__r = lVar7;
      lVar9 = (addr->nTime).__d.__r;
    }
    pSVar1 = &(this_00->super_CAddress).nServices;
    *pSVar1 = *pSVar1 | addr->nServices;
    if (((lVar9 <= lVar7) || (this_00->fInTried != false)) ||
       (iVar4 = this_00->nRefCount, iVar4 == 8)) goto LAB_0084bb66;
    if (0 < iVar4) {
      uVar14 = ~(-1 << ((byte)iVar4 & 0x1f));
      uVar3 = 0x20;
      if (uVar14 != 0) {
        uVar3 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = uVar3 ^ 0x1f;
      }
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,0x20 - uVar3)
        ;
      } while (uVar14 < uVar8);
      if (uVar8 != 0) goto LAB_0084bb66;
    }
  }
  iVar4 = AddrInfo::GetNewBucket(this_00,&this->nKey,source,this->m_netgroupman);
  nUBucket = iVar4;
  uVar3 = AddrInfo::GetBucketPosition(this_00,&this->nKey,true,iVar4);
  lVar13 = (ulong)(uint)(iVar4 << 9) + 0x20180;
  uVar12 = (ulong)uVar3;
  lVar9 = *(long *)((long)this->vvNew[0] + uVar12 * 8 + lVar13 + -0x20180);
  bVar2 = lVar9 == -1;
  nUBucketPos = uVar3;
  if (lVar9 == nId) goto LAB_0084bb68;
  if (lVar9 != -1) {
    this_01 = std::__detail::
              _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->mapInfo,
                           (key_type *)((long)this->vvNew[0] + uVar12 * 8 + lVar13 + -0x20180));
    tVar6 = NodeClock::now();
    bVar2 = AddrInfo::IsTerrible(this_01,(NodeSeconds)((long)tVar6.__d.__r / 1000000000));
    if (!bVar2) {
      if (this_01->nRefCount < 2) {
        if (this_00->nRefCount == 0) {
          Delete(this,nId);
        }
      }
      else if (this_00->nRefCount == 0) goto LAB_0084baa6;
LAB_0084bb66:
      bVar2 = false;
      goto LAB_0084bb68;
    }
  }
LAB_0084baa6:
  ClearNew(this,iVar4,uVar3);
  this_00->nRefCount = this_00->nRefCount + 1;
  *(nid_type *)((long)this->vvNew[0] + uVar12 * 8 + (ulong)(uint)(iVar4 << 9)) = nId;
  uVar5 = NetGroupManager::GetMappedAS(this->m_netgroupman,(CNetAddr *)addr);
  mapped_as = uVar5;
  this_02 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_02,ADDRMAN,Debug);
  if (bVar2) {
    CService::ToStringAddrPort_abi_cxx11_(&local_58,&addr->super_CService);
    if (uVar5 == 0) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    }
    else {
      tinyformat::format<unsigned_int>(&local_78," mapped to AS%i",&mapped_as);
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "AddSingle";
    logging_function._M_len = 9;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,int>
              (logging_function,source_file,0x268,ADDRMAN,Debug,(ConstevalFormatString<4U>)0xf6ce8d,
               &local_58,&local_78,&nUBucket,&nUBucketPos);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = true;
LAB_0084bb68:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool AddrManImpl::AddSingle(const CAddress& addr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    AssertLockHeld(cs);

    if (!addr.IsRoutable())
        return false;

    nid_type nId;
    AddrInfo* pinfo = Find(addr, &nId);

    // Do not set a penalty for a source's self-announcement
    if (addr == source) {
        time_penalty = 0s;
    }

    if (pinfo) {
        // periodically update nTime
        const bool currently_online{NodeClock::now() - addr.nTime < 24h};
        const auto update_interval{currently_online ? 1h : 24h};
        if (pinfo->nTime < addr.nTime - update_interval - time_penalty) {
            pinfo->nTime = std::max(NodeSeconds{0s}, addr.nTime - time_penalty);
        }

        // add services
        pinfo->nServices = ServiceFlags(pinfo->nServices | addr.nServices);

        // do not update if no new information is present
        if (addr.nTime <= pinfo->nTime) {
            return false;
        }

        // do not update if the entry was already in the "tried" table
        if (pinfo->fInTried)
            return false;

        // do not update if the max reference count is reached
        if (pinfo->nRefCount == ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
            return false;

        // stochastic test: previous nRefCount == N: 2^N times harder to increase it
        if (pinfo->nRefCount > 0) {
            const int nFactor{1 << pinfo->nRefCount};
            if (insecure_rand.randrange(nFactor) != 0) return false;
        }
    } else {
        pinfo = Create(addr, source, &nId);
        pinfo->nTime = std::max(NodeSeconds{0s}, pinfo->nTime - time_penalty);
    }

    int nUBucket = pinfo->GetNewBucket(nKey, source, m_netgroupman);
    int nUBucketPos = pinfo->GetBucketPosition(nKey, true, nUBucket);
    bool fInsert = vvNew[nUBucket][nUBucketPos] == -1;
    if (vvNew[nUBucket][nUBucketPos] != nId) {
        if (!fInsert) {
            AddrInfo& infoExisting = mapInfo[vvNew[nUBucket][nUBucketPos]];
            if (infoExisting.IsTerrible() || (infoExisting.nRefCount > 1 && pinfo->nRefCount == 0)) {
                // Overwrite the existing new table entry.
                fInsert = true;
            }
        }
        if (fInsert) {
            ClearNew(nUBucket, nUBucketPos);
            pinfo->nRefCount++;
            vvNew[nUBucket][nUBucketPos] = nId;
            const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
            LogDebug(BCLog::ADDRMAN, "Added %s%s to new[%i][%i]\n",
                     addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), nUBucket, nUBucketPos);
        } else {
            if (pinfo->nRefCount == 0) {
                Delete(nId);
            }
        }
    }
    return fInsert;
}